

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool Fossilize::Hashing::hash_pnext_struct
               (StateRecorder *recorder,Hasher *h,VkPipelineLibraryCreateInfoKHR *info)

{
  uint uVar1;
  bool bVar2;
  ulong uVar3;
  bool bVar4;
  Hash hash;
  Hash local_38;
  
  local_38 = 0;
  uVar1 = info->libraryCount;
  h->h = h->h * 0x100000001b3 ^ (ulong)uVar1;
  bVar4 = (ulong)uVar1 == 0;
  if ((!bVar4) &&
     (bVar2 = StateRecorder::get_hash_for_pipeline_library_handle
                        (recorder,*info->pLibraries,&local_38), bVar2)) {
    uVar3 = 1;
    do {
      h->h = (local_38 & 0xffffffff ^ h->h * 0x100000001b3) * 0x100000001b3 ^ local_38 >> 0x20;
      bVar4 = info->libraryCount <= uVar3;
      if (bVar4) {
        return bVar4;
      }
      bVar2 = StateRecorder::get_hash_for_pipeline_library_handle
                        (recorder,info->pLibraries[uVar3],&local_38);
      uVar3 = uVar3 + 1;
    } while (bVar2);
  }
  return bVar4;
}

Assistant:

static bool hash_pnext_struct(const StateRecorder *recorder,
                              Hasher &h,
                              const VkPipelineLibraryCreateInfoKHR &info)
{
	Hash hash = 0;
	h.u32(info.libraryCount);

	for (uint32_t i = 0; i < info.libraryCount; i++)
	{
		if (!recorder->get_hash_for_pipeline_library_handle(info.pLibraries[i], &hash))
			return false;
		h.u64(hash);
	}

	return true;
}